

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf::to_object(xr_ogf *this,xr_sg_type sg_type)

{
  uint32_t *puVar1;
  pointer ppxVar2;
  xr_ogf *pxVar3;
  int iVar4;
  int iVar5;
  xr_mesh_builder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  string *name;
  pointer ppxVar6;
  uint16_t texture;
  size_t num_indices;
  size_t num_vertices;
  uint signature;
  
  this_00 = (xr_mesh_builder *)operator_new(600);
  xr_mesh_builder::xr_mesh_builder(this_00,sg_type);
  iVar4 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])(this);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])(this)
    ;
    xr_mesh_builder::prepare(this_00,*(uint32_t *)(CONCAT44(extraout_var_02,iVar4) + 0x18),0,0);
    iVar4 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])(this)
    ;
    iVar5 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])(this)
    ;
    xr_mesh_builder::push
              (this_00,(xr_vbuf *)CONCAT44(extraout_var_03,iVar4),
               (xr_ibuf *)CONCAT44(extraout_var_04,iVar5),0,0);
  }
  else {
    ppxVar2 = (this->m_children).
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    signature = 0;
    num_indices = 0;
    num_vertices = 0;
    for (ppxVar6 = (this->m_children).
                   super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppxVar6 != ppxVar2; ppxVar6 = ppxVar6 + 1) {
      pxVar3 = *ppxVar6;
      iVar4 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar3);
      signature = signature | *(uint *)(CONCAT44(extraout_var,iVar4) + 0x18);
      iVar4 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar3);
      num_vertices = num_vertices + *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x10);
      iVar4 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        (pxVar3);
      num_indices = num_indices + *(long *)(CONCAT44(extraout_var_01,iVar4) + 0x10);
      iVar4 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x19])
                        (pxVar3);
      if ((char)iVar4 != '\0') {
        puVar1 = &(this->super_xr_object).m_flags;
        *(byte *)puVar1 = (byte)*puVar1 | 2;
      }
    }
    xr_mesh_builder::prepare(this_00,signature,num_vertices,num_indices);
    ppxVar2 = (this->m_children).
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    texture = 0;
    for (ppxVar6 = (this->m_children).
                   super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppxVar6 != ppxVar2; ppxVar6 = ppxVar6 + 1) {
      pxVar3 = *ppxVar6;
      iVar4 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar3);
      iVar5 = (*(pxVar3->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        (pxVar3);
      xr_mesh_builder::push
                (this_00,(xr_vbuf *)CONCAT44(extraout_var_05,iVar4),
                 (xr_ibuf *)CONCAT44(extraout_var_06,iVar5),texture,texture);
      texture = texture + 1;
    }
  }
  xr_mesh_builder::compact_geometry(this_00);
  xr_mesh_builder::remove_duplicate_faces(this_00);
  xr_mesh_builder::remove_back_faces(this_00,1e-06);
  xr_mesh_builder::commit(this_00,&this->super_xr_object);
  if ((this->m_path)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&(this_00->super_xr_mesh).m_name);
  }
  else {
    name = &(this_00->super_xr_mesh).m_name;
    xr_file_system::split_path(&this->m_path,(string *)0x0,name,(string *)0x0);
    std::__cxx11::string::append((char *)name);
  }
  (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[6])(this);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  return;
}

Assistant:

void xr_ogf::to_object(xr_sg_type sg_type)
{
	xr_mesh_builder* mesh = new xr_mesh_builder(sg_type);
	if (hierarchical()) {
		size_t vb_reserve = 0, ib_reserve = 0;
		unsigned vb_signature = 0;
		for (xr_ogf_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it) {
			xr_ogf* ogf = *it;
			vb_signature |= ogf->vb().signature();
			vb_reserve += ogf->vb().size();
			ib_reserve += ogf->ib().size();
			if (ogf->progressive())
				m_flags |= EOF_PROGRESSIVE;
		}
		mesh->prepare(vb_signature, vb_reserve, ib_reserve);
		uint16_t shader_id = 0;
		for (xr_ogf_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it) {
			xr_ogf* ogf = *it;
			mesh->push(ogf->vb(), ogf->ib(), shader_id, shader_id);
			++shader_id;
		}
	} else {
		mesh->prepare(vb().signature());
		mesh->push(vb(), ib(), 0, 0);
	}
	mesh->compact_geometry();
	mesh->remove_duplicate_faces();
	mesh->remove_back_faces();
	mesh->commit(*this);
	if (m_path.empty()) {
		mesh->name() = "ogfShape";
	} else {
		xr_file_system::split_path(m_path, 0, &mesh->name());
		mesh->name() += "Shape";
	}
	denominate_surfaces();
	trim_container(m_children);
	trim_container(m_lods);
}